

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetupDrawChannels(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  char cVar5;
  ImGuiTableDrawChannelIdx IVar6;
  long lVar7;
  long lVar8;
  int channels_count;
  char cVar9;
  int iVar10;
  bool bVar11;
  
  iVar10 = 1;
  if ((table->Flags & 0x100000) == 0) {
    iVar10 = (int)table->ColumnsEnabledCount;
  }
  bVar11 = true;
  if (table->ColumnsCount <= (int)table->ColumnsEnabledCount) {
    bVar11 = table->VisibleMaskByIndex != table->EnabledMaskByIndex;
  }
  channels_count =
       ('\0' < table->FreezeRowsCount | 2) + (uint)bVar11 +
       (iVar10 << ('\0' < table->FreezeRowsCount));
  ImDrawListSplitter::Split(table->DrawSplitter,table->InnerWindow->DrawList,channels_count);
  IVar6 = 0xff;
  if (bVar11 != false) {
    IVar6 = (char)channels_count + 0xff;
  }
  table->DummyDrawChannel = IVar6;
  table->Bg2DrawChannelCurrent = '\x01';
  IVar6 = '\x01';
  if ('\0' < table->FreezeRowsCount) {
    IVar6 = (char)iVar10 + '\x02';
  }
  table->Bg2DrawChannelUnfrozen = IVar6;
  if (0 < table->ColumnsCount) {
    cVar5 = '\x02';
    lVar7 = 0x57;
    lVar8 = 0;
    do {
      pIVar1 = (table->Columns).Data;
      if ((*(char *)((long)&pIVar1->WidthGiven + lVar7 + 2) == '\x01') &&
         (*(char *)((long)&pIVar1->WidthGiven + lVar7 + 3) == '\x01')) {
        *(char *)((long)&pIVar1->Flags + lVar7 + 1) = cVar5;
        cVar9 = '\0';
        if ('\0' < table->FreezeRowsCount) {
          cVar9 = (char)iVar10 + '\x01';
        }
        *(char *)((long)&pIVar1->Flags + lVar7 + 2) = cVar9 + cVar5;
        cVar5 = cVar5 + ((table->Flags & 0x100000) == 0);
      }
      else {
        IVar6 = table->DummyDrawChannel;
        *(ImGuiTableDrawChannelIdx *)((long)&pIVar1->Flags + lVar7 + 2) = IVar6;
        *(ImGuiTableDrawChannelIdx *)((long)&pIVar1->Flags + lVar7 + 1) = IVar6;
      }
      *(undefined1 *)((long)&pIVar1->Flags + lVar7) =
           *(undefined1 *)((long)&pIVar1->Flags + lVar7 + 1);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x68;
    } while (lVar8 < table->ColumnsCount);
  }
  IVar2 = (table->InnerClipRect).Max;
  IVar3 = (table->HostClipRect).Min;
  IVar4 = (table->HostClipRect).Max;
  (table->BgClipRect).Min = (table->InnerClipRect).Min;
  (table->BgClipRect).Max = IVar2;
  IVar2 = (table->OuterWindow->ClipRect).Max;
  (table->Bg0ClipRectForDrawCmd).Min = (table->OuterWindow->ClipRect).Min;
  (table->Bg0ClipRectForDrawCmd).Max = IVar2;
  (table->Bg2ClipRectForDrawCmd).Min = IVar3;
  (table->Bg2ClipRectForDrawCmd).Max = IVar4;
  return;
}

Assistant:

void ImGui::TableSetupDrawChannels(ImGuiTable* table)
{
    const int freeze_row_multiplier = (table->FreezeRowsCount > 0) ? 2 : 1;
    const int channels_for_row = (table->Flags & ImGuiTableFlags_NoClip) ? 1 : table->ColumnsEnabledCount;
    const int channels_for_bg = 1 + 1 * freeze_row_multiplier;
    const int channels_for_dummy = (table->ColumnsEnabledCount < table->ColumnsCount || table->VisibleMaskByIndex != table->EnabledMaskByIndex) ? +1 : 0;
    const int channels_total = channels_for_bg + (channels_for_row * freeze_row_multiplier) + channels_for_dummy;
    table->DrawSplitter->Split(table->InnerWindow->DrawList, channels_total);
    table->DummyDrawChannel = (ImGuiTableDrawChannelIdx)((channels_for_dummy > 0) ? channels_total - 1 : -1);
    table->Bg2DrawChannelCurrent = TABLE_DRAW_CHANNEL_BG2_FROZEN;
    table->Bg2DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)((table->FreezeRowsCount > 0) ? 2 + channels_for_row : TABLE_DRAW_CHANNEL_BG2_FROZEN);

    int draw_channel_current = 2;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->IsVisibleX && column->IsVisibleY)
        {
            column->DrawChannelFrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current);
            column->DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current + (table->FreezeRowsCount > 0 ? channels_for_row + 1 : 0));
            if (!(table->Flags & ImGuiTableFlags_NoClip))
                draw_channel_current++;
        }
        else
        {
            column->DrawChannelFrozen = column->DrawChannelUnfrozen = table->DummyDrawChannel;
        }
        column->DrawChannelCurrent = column->DrawChannelFrozen;
    }

    // Initial draw cmd starts with a BgClipRect that matches the one of its host, to facilitate merge draw commands by default.
    // All our cell highlight are manually clipped with BgClipRect. When unfreezing it will be made smaller to fit scrolling rect.
    // (This technically isn't part of setting up draw channels, but is reasonably related to be done here)
    table->BgClipRect = table->InnerClipRect;
    table->Bg0ClipRectForDrawCmd = table->OuterWindow->ClipRect;
    table->Bg2ClipRectForDrawCmd = table->HostClipRect;
    IM_ASSERT(table->BgClipRect.Min.y <= table->BgClipRect.Max.y);
}